

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int tcache_flush_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                    size_t newlen)

{
  int iVar1;
  uint ind;
  
  iVar1 = 1;
  if (oldp == (void *)0x0 && oldlenp == (size_t *)0x0) {
    if (newp == (void *)0x0) {
      ind = 0xffffffff;
    }
    else {
      if (newlen != 4) {
        return 0x16;
      }
      ind = *newp;
    }
    if (ind == 0xffffffff) {
      iVar1 = 0xe;
    }
    else {
      tcaches_flush(tsd,ind);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
tcache_flush_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	tcache_ind = UINT_MAX;
	WRITE(tcache_ind, unsigned);
	if (tcache_ind == UINT_MAX) {
		ret = EFAULT;
		goto label_return;
	}
	tcaches_flush(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}